

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTimeAccess.cpp
# Opt level: O1

long __thiscall bhf::ads::RTimeAccess::ShowLatency(RTimeAccess *this,uint32_t indexOffset)

{
  uint8_t cpuId;
  ulong uVar1;
  RTimeCpuSettings info;
  RTimeCpuSettings local_40;
  
  ReadCpuSettings(&local_40,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RTimeCpuSettings:\n",0x12);
  ::operator<<((ostream *)&std::cout,&local_40);
  uVar1 = 0;
  do {
    if ((local_40.affinityMask >> (uVar1 & 0x3f) & 1) != 0) {
      ShowLatency(this,indexOffset,(uint32_t)uVar1);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x40);
  return 0;
}

Assistant:

long RTimeAccess::ShowLatency(const uint32_t indexOffset) const
{
    const auto info = ReadCpuSettings();

    std::cout << "RTimeCpuSettings:\n" << info;
    for (uint8_t cpuId = 0; cpuId < 8 * sizeof(info.affinityMask); ++cpuId) {
        static_assert((8 * sizeof(info.affinityMask) < std::numeric_limits<decltype(cpuId)>::max()),
                      "cpuId is to small for affinityMask");
        if (info.affinityMask & (1ULL << cpuId)) {
            ShowLatency(indexOffset, cpuId);
        }
    }
    return 0;
}